

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_acceptor.h
# Opt level: O2

void __thiscall
cppcms::impl::cgi::
socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
::on_accept(socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
            *this,error_code *e)

{
  context *this_00;
  shared_ptr<cppcms::http::context> cnt;
  __shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  if (e->_M_value == 0) {
    if (this->tcp_ == true) {
      booster::aio::basic_socket::set_option(this->asio_socket_,0,1);
    }
    if (this->sndbuf_ != -1) {
      booster::aio::basic_socket::set_option(this->asio_socket_,1);
    }
    if (this->rcvbuf_ != -1) {
      booster::aio::basic_socket::set_option(this->asio_socket_,0);
    }
    this_00 = (context *)operator_new(0x28);
    std::__shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,
               &(this->api_).
                super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>);
    cppcms::http::context::context(this_00,(shared_ptr<cppcms::impl::cgi::connection> *)&local_38);
    std::__shared_ptr<cppcms::http::context,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppcms::http::context,void>
              ((__shared_ptr<cppcms::http::context,(__gnu_cxx::_Lock_policy)2> *)&cnt,this_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    std::__shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->api_).
                super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>);
    cppcms::http::context::run
              (cnt.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&cnt.super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  (**(this->super_acceptor)._vptr_acceptor)(this);
  return;
}

Assistant:

void on_accept(booster::system::error_code const &e)
			{
				if(!e) {
					
					if(tcp_)
						asio_socket_->set_option(io::basic_socket::tcp_no_delay,true);
					if(sndbuf_!=-1)
						asio_socket_->set_option(io::basic_socket::send_buffer_size,sndbuf_);
					if(rcvbuf_!=-1)
						asio_socket_->set_option(io::basic_socket::receive_buffer_size,rcvbuf_);
					booster::shared_ptr< ::cppcms::http::context> cnt(new ::cppcms::http::context(api_));
					api_.reset();
					cnt->run();	
				}
				async_accept();
			}